

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall CConnman::SetTryNewOutboundPeer(CConnman *this,bool flag)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  Logger *pLVar3;
  char **args;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  char **local_c0 [14];
  string local_50;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  LOCK();
  (this->m_try_another_outbound_peer)._M_base._M_i = flag;
  UNLOCK();
  bVar2 = ::LogAcceptCategory(NET,Debug);
  if (bVar2) {
    args = (char **)0xe0ebd1;
    if (flag) {
      args = (char **)0xe2c245;
    }
    local_c0[0] = args;
    pLVar3 = LogInstance();
    bVar2 = BCLog::Logger::Enabled(pLVar3);
    if (bVar2) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_local_buf[0] = '\0';
      tinyformat::format<char_const*>
                (&local_50,(tinyformat *)"setting try another outbound peer=%s\n",(char *)local_c0,
                 args);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      pLVar3 = LogInstance();
      local_50._M_dataplus._M_p = &DAT_00000050;
      local_50._M_string_length = 0xcad8a1;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
      source_file._M_len = 0x50;
      str._M_str = log_msg._M_dataplus._M_p;
      str._M_len = log_msg._M_string_length;
      logging_function._M_str = "SetTryNewOutboundPeer";
      logging_function._M_len = 0x15;
      BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0x939,NET,Debug);
      std::__cxx11::string::~string((string *)&log_msg);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::SetTryNewOutboundPeer(bool flag)
{
    m_try_another_outbound_peer = flag;
    LogDebug(BCLog::NET, "setting try another outbound peer=%s\n", flag ? "true" : "false");
}